

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O0

Type * get_array_type(Type *array_of,AST *number_of_elements,Translation_Data *translation_data)

{
  Type *pTVar1;
  Map *pMVar2;
  Type_Array *ret;
  Translation_Data *translation_data_local;
  AST *number_of_elements_local;
  Type *array_of_local;
  
  pTVar1 = (Type *)calloc(1,0x28);
  pTVar1->specifier = TS_ARRAY;
  *(undefined8 *)(pTVar1 + 1) = 0;
  if (number_of_elements == (AST *)0x0) {
    pTVar1[1].node = (Map *)0x0;
  }
  else {
    pMVar2 = (Map *)evaluate_const_expression_integer(number_of_elements,translation_data);
    pTVar1[1].node = pMVar2;
    delete_ast(number_of_elements);
  }
  *(Type **)(pTVar1 + 2) = array_of;
  pTVar1 = type_check_and_push(pTVar1,array_of->node,0x28);
  return pTVar1;
}

Assistant:

struct Type* get_array_type(struct Type *array_of,struct AST* number_of_elements,struct Translation_Data *translation_data)
{
	struct Type_Array *ret;
	ret=calloc(1,sizeof(struct Type_Array));
	ret->specifier=TS_ARRAY;
	ret->size=0;
	if(number_of_elements!=NULL)
	{
		ret->number_of_elements=evaluate_const_expression_integer(number_of_elements,translation_data);
		delete_ast(number_of_elements);
	}else
	{
		ret->number_of_elements=0;
	}
	ret->is_array_of=array_of;
	ret=(struct Type_Array*)type_check_and_push((struct Type*)ret,array_of->node,sizeof(struct Type_Array));
	return (struct Type*)ret;


}